

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O3

double __thiscall
chrono::ChFunction::Compute_sqrmean
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  int iVar1;
  double dVar2;
  double mx;
  double dVar3;
  undefined1 auVar4 [16];
  
  if (xmin <= xmax) {
    dVar2 = 0.0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + 1;
      dVar3 = xmin;
      (*this->_vptr_ChFunction[10])(this,derivate);
      dVar2 = dVar2 + dVar3 * dVar3;
      xmin = xmin + sampling_step;
    } while (xmin <= xmax);
    auVar4._0_8_ = dVar2 / (double)iVar1;
    auVar4._8_8_ = 0;
  }
  else {
    auVar4 = ZEXT816(0x7ff8000000000000);
  }
  if (0.0 <= auVar4._0_8_) {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    return auVar4._0_8_;
  }
  dVar2 = sqrt(auVar4._0_8_);
  return dVar2;
}

Assistant:

double ChFunction::Compute_sqrmean(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = 0;
    int numpts = 0;
    for (double mx = xmin; mx <= xmax; mx = mx + sampling_step) {
        numpts++;
        mret += pow(this->Get_y_dN(mx, derivate), 2.);
    }
    return sqrt(mret / ((double)numpts));
}